

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucci.cpp
# Opt level: O0

int CheckInput(int *param_1)

{
  fd_set *__arr;
  uint __i;
  int data;
  timeval tv;
  fd_set readfds;
  uint local_a0;
  timeval local_98;
  fd_set local_88;
  
  for (local_a0 = 0; local_a0 < 0x10; local_a0 = local_a0 + 1) {
    local_88.fds_bits[local_a0] = 0;
  }
  local_88.fds_bits[0] = local_88.fds_bits[0] | 1;
  local_98.tv_sec = 0;
  local_98.tv_usec = 0;
  select(0x10,&local_88,(fd_set *)0x0,(fd_set *)0x0,&local_98);
  return (uint)((local_88.fds_bits[0] & 1U) != 0);
}

Assistant:

int /* bool */ CheckInput(int &) {
    fd_set readfds;
    timeval tv;
    int /* bool */ data;
    FD_ZERO(&readfds);
    FD_SET(0, &readfds);
    tv.tv_sec = 0;
    tv.tv_usec = 0;
    select(16, &readfds, 0, 0, &tv);
    data = FD_ISSET(0, &readfds);
    return data;
}